

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

void mpp_trie_dump(MppTrie trie,char *func)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  RK_S32 tag_len [17];
  RK_S32 next_cnt [17];
  
  next_cnt[0] = 0;
  next_cnt[1] = 0;
  next_cnt[2] = 0;
  next_cnt[3] = 0;
  next_cnt[4] = 0;
  next_cnt[5] = 0;
  next_cnt[6] = 0;
  next_cnt[7] = 0;
  next_cnt[8] = 0;
  next_cnt[9] = 0;
  next_cnt[10] = 0;
  next_cnt[0xb] = 0;
  next_cnt[0xc] = 0;
  next_cnt[0xd] = 0;
  next_cnt[0xe] = 0;
  next_cnt[0xf] = 0;
  next_cnt[0x10] = 0;
  tag_len[0] = 0;
  tag_len[1] = 0;
  tag_len[2] = 0;
  tag_len[3] = 0;
  tag_len[4] = 0;
  tag_len[5] = 0;
  tag_len[6] = 0;
  tag_len[7] = 0;
  tag_len[8] = 0;
  tag_len[9] = 0;
  tag_len[10] = 0;
  tag_len[0xb] = 0;
  tag_len[0xc] = 0;
  tag_len[0xd] = 0;
  tag_len[0xe] = 0;
  tag_len[0xf] = 0;
  tag_len[0x10] = 0;
  _mpp_log_l(4,"mpp_trie","%s dumping trie %p\n",(char *)0x0,func,trie);
  _mpp_log_l(4,"mpp_trie","name %s size %d node %d info %d\n",(char *)0x0,*trie,
             (ulong)*(uint *)((long)trie + 0xc),(ulong)*(uint *)((long)trie + 0x2c),
             (ulong)*(uint *)((long)trie + 0x18));
  iVar4 = *(int *)((long)trie + 0x2c);
  if (0 < iVar4) {
    lVar9 = 0;
    lVar10 = 0;
    do {
      lVar2 = *(long *)((long)trie + 0x30);
      lVar3 = lVar10 * 0x38 + lVar2;
      if ((lVar10 == 0) || (*(short *)(lVar3 + 0x24) != 0)) {
        iVar1 = *(int *)(lVar3 + 0x20);
        lVar6 = (long)iVar1;
        if (lVar6 < 0) {
          _mpp_log_l(4,"mpp_trie","node %d key %x\n",(char *)0x0,
                     (ulong)(uint)(int)*(short *)(lVar3 + 0x24),(ulong)*(ushort *)(lVar3 + 0x30));
        }
        else {
          if ((SBORROW4(iVar1,iVar4 * 0x38) == iVar1 + iVar4 * -0x38 < 0) ||
             (*(long *)((long)trie + 0x40) == 0)) {
            lVar7 = lVar6 + lVar2 + 4;
          }
          else {
            lVar7 = *(long *)((long)trie + 0x40) +
                    (long)*(int *)(*(long *)((long)trie + 0x20) + 0x10 + lVar6 * 0x14);
          }
          _mpp_log_l(4,"mpp_trie","node %d key %x info %d - %s\n",(char *)0x0,
                     (ulong)(uint)(int)*(short *)(lVar3 + 0x24),(ulong)*(ushort *)(lVar3 + 0x30),
                     lVar6,lVar7);
        }
        if ((int)*(short *)(lVar3 + 0x32) == 0) {
          _mpp_log_l(4,"mpp_trie","    prev %d count %d\n",(char *)0x0,
                     (ulong)(uint)(int)*(short *)(lVar3 + 0x26),(ulong)*(ushort *)(lVar3 + 0x34));
        }
        else {
          _mpp_log_l(4,"mpp_trie","    prev %d count %d tag %d - %llx\n",(char *)0x0,
                     (ulong)(uint)(int)*(short *)(lVar3 + 0x26),(ulong)*(ushort *)(lVar3 + 0x34),
                     (ulong)(uint)(int)*(short *)(lVar3 + 0x32),*(undefined8 *)(lVar3 + 0x28));
        }
        uVar8 = 0;
        uVar11 = 0;
        do {
          uVar5 = (uint)*(short *)(lVar2 + lVar9 + uVar8 * 2);
          if (0 < (int)uVar5) {
            _mpp_log_l(4,"mpp_trie","    next %d:%d -> %d\n",(char *)0x0,uVar11,uVar8 & 0xffffffff,
                       (ulong)uVar5);
            uVar11 = (ulong)((int)uVar11 + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 0x10);
        next_cnt[(int)uVar11] = next_cnt[(int)uVar11] + 1;
        tag_len[*(short *)(lVar3 + 0x32)] = tag_len[*(short *)(lVar3 + 0x32)] + 1;
        iVar4 = *(int *)((long)trie + 0x2c);
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar10 < iVar4);
  }
  _mpp_log_l(4,"mpp_trie","node | next |  tag | used %d\n",(char *)0x0);
  uVar11 = 0;
  do {
    if (next_cnt[uVar11] != 0 || tag_len[uVar11] != 0) {
      _mpp_log_l(4,"mpp_trie","%2d   | %4d | %4d |\n",(char *)0x0,uVar11 & 0xffffffff,
                 (ulong)(uint)next_cnt[uVar11],(ulong)(uint)tag_len[uVar11]);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x11);
  _mpp_log_l(4,"mpp_trie","%s dumping node end\n",(char *)0x0,func);
  return;
}

Assistant:

void mpp_trie_dump(MppTrie trie, const char *func)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    RK_S32 i;
    RK_S32 next_cnt[17];
    RK_S32 tag_len[17];

    memset(next_cnt, 0, sizeof(next_cnt));
    memset(tag_len, 0, sizeof(tag_len));

    mpp_logi("%s dumping trie %p\n", func, trie);
    mpp_logi("name %s size %d node %d info %d\n",
             p->name, p->buf_size, p->node_used, p->info_used);

    for (i = 0; i < p->node_used; i++) {
        MppTrieNode *node = &p->nodes[i];
        RK_S32 valid_count = 0;
        RK_S32 j;

        if (i && !node->idx)
            continue;

        if (node->id >= 0) {
            /* check before and after last info */
            if (node->id < (RK_S32)(p->node_used * sizeof(MppTrieNode)))
                mpp_logi("node %d key %x info %d - %s\n", node->idx, node->key, node->id,
                         p->name_buf ? ((char *)p->name_buf + p->info[node->id].name_offset) :
                         mpp_trie_info_name(((MppTrieInfo *)((char *)p->nodes + node->id))));
            else
                mpp_logi("node %d key %x info %d - %s\n", node->idx, node->key, node->id,
                         mpp_trie_info_name(((MppTrieInfo *)((char *)p->nodes + node->id))));
        } else
            mpp_logi("node %d key %x\n", node->idx, node->key);

        if (node->tag_len)
            mpp_logi("    prev %d count %d tag %d - %llx\n", node->prev, node->next_cnt, node->tag_len, node->tag_val);
        else
            mpp_logi("    prev %d count %d\n", node->prev, node->next_cnt);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (node->next[j] > 0) {
                mpp_logi("    next %d:%d -> %d\n", valid_count, j, node->next[j]);
                valid_count++;
            }
        }

        next_cnt[valid_count]++;
        tag_len[node->tag_len]++;
    }

    mpp_logi("node | next |  tag | used %d\n", p->node_used);

    for (i = 0; i < 17; i++) {
        if (next_cnt[i] || tag_len[i])
            mpp_logi("%2d   | %4d | %4d |\n", i, next_cnt[i], tag_len[i]);
    }

    mpp_logi("%s dumping node end\n", func);
}